

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall Builder::FinishCommand(Builder *this,Result *result,string *err)

{
  Edge *this_00;
  BindingEnv *pBVar1;
  BuildLog *this_01;
  Node *node;
  Metrics *this_02;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined4 extraout_var_02;
  int *piVar9;
  long *plVar10;
  Metric *pMVar11;
  size_type *psVar12;
  pointer ppNVar13;
  long mtime;
  bool bVar14;
  string rspfile;
  int end_time;
  int start_time;
  string deps_prefix;
  vector<Node_*,_std::allocator<Node_*>_> deps_nodes;
  string deps_type;
  ScopedMetric metrics_h_scoped;
  string local_178;
  string *local_158;
  string local_150;
  int local_130;
  int local_12c;
  string local_128;
  long *local_108 [2];
  long local_f8 [2];
  vector<Node_*,_std::allocator<Node_*>_> local_e8;
  string local_d0;
  DependencyScan *local_b0;
  Plan *local_a8;
  string local_a0;
  string local_80;
  string local_60;
  ScopedMetric local_40;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  local_158 = err;
  if ((FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar5 = __cxa_guard_acquire(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                                   metrics_h_metric), this_02 = g_metrics, iVar5 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar11 = (Metric *)0x0;
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"FinishCommand","");
      pMVar11 = Metrics::NewMetric(this_02,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    FinishCommand::metrics_h_metric = pMVar11;
    __cxa_guard_release(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,FinishCommand::metrics_h_metric);
  this_00 = result->edge;
  local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"deps","");
  Edge::GetBinding(&local_d0,this_00,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"msvc_deps_prefix","");
  Edge::GetBinding(&local_128,this_00,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  if (local_d0._M_string_length != 0) {
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    local_178._M_string_length = 0;
    local_178.field_2._M_local_buf[0] = '\0';
    bVar2 = ExtractDeps(this,result,&local_d0,&local_128,&local_e8,&local_178);
    if ((!bVar2) && (result->status == ExitSuccess)) {
      if ((result->output)._M_string_length != 0) {
        std::__cxx11::string::append((char *)&result->output);
      }
      std::__cxx11::string::_M_append((char *)&result->output,(ulong)local_178._M_dataplus._M_p);
      result->status = ExitFailure;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,
                      CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                               local_178.field_2._M_local_buf[0]) + 1);
    }
  }
  BuildStatus::BuildEdgeFinished
            (this->status_,this_00,result->status == ExitSuccess,&result->output,&local_12c,
             &local_130);
  if (result->status != ExitSuccess) {
    bVar2 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeFailed,local_158);
    goto LAB_0017d5e9;
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"restat","");
  bVar2 = Edge::GetBindingBool(this_00,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  if (this->config_->dry_run == false) {
    ppNVar13 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    bVar4 = ppNVar13 ==
            (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar4) {
      mtime = 0;
      bVar14 = false;
    }
    else {
      local_a8 = &this->plan_;
      local_b0 = &this->scan_;
      bVar14 = false;
      mtime = 0;
      do {
        iVar5 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                          (this->disk_interface_,&(*ppNVar13)->env_path_,local_158);
        lVar6 = CONCAT44(extraout_var,iVar5);
        if (lVar6 == -1) {
          bVar3 = false;
        }
        else {
          if (mtime < lVar6) {
            mtime = lVar6;
          }
          bVar3 = true;
          if (((*ppNVar13)->mtime_ == lVar6 && bVar2) &&
             (bVar3 = Plan::CleanNode(local_a8,local_b0,*ppNVar13,local_158), bVar3)) {
            bVar14 = true;
          }
        }
        if (bVar3 == false) break;
        ppNVar13 = ppNVar13 + 1;
        bVar4 = ppNVar13 ==
                (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      } while (!bVar4);
    }
    if ((bVar4) && (bVar14)) {
      ppNVar13 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      bVar2 = ppNVar13 ==
              (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
      if (bVar2) {
        lVar6 = 0;
      }
      else {
        lVar6 = 0;
        do {
          iVar5 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                            (this->disk_interface_,&(*ppNVar13)->env_path_,local_158);
          lVar7 = CONCAT44(extraout_var_00,iVar5);
          lVar8 = lVar6;
          if (lVar6 < lVar7) {
            lVar8 = lVar7;
          }
          if (lVar7 == -1) break;
          ppNVar13 = ppNVar13 + 1;
          bVar2 = ppNVar13 ==
                  (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
          lVar6 = lVar8;
        } while (!bVar2);
      }
      if (bVar2) {
        Edge::GetUnescapedDepfile_abi_cxx11_(&local_178,this_00);
        if (lVar6 == 0) {
          lVar6 = 0;
LAB_0017d2ef:
          mtime = lVar6;
          this->status_->total_edges_ = (this->plan_).command_edges_;
          bVar4 = true;
        }
        else {
          if ((local_d0._M_string_length != 0) || (local_178._M_string_length == 0))
          goto LAB_0017d2ef;
          pBVar1 = this_00->env_;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,local_178._M_dataplus._M_p,
                     local_178._M_dataplus._M_p + local_178._M_string_length);
          RelPathEnv::ApplyChdir(&local_150,&pBVar1->super_RelPathEnv,&local_80);
          std::__cxx11::string::operator=((string *)&local_178,(string *)&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          iVar5 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                            (this->disk_interface_,&local_178,local_158);
          lVar8 = CONCAT44(extraout_var_01,iVar5);
          if (lVar6 < lVar8) {
            lVar6 = lVar8;
          }
          if (lVar8 != -1) goto LAB_0017d2ef;
          bVar4 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,
                          CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                   local_178.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        bVar4 = false;
      }
    }
    if (bVar4) goto LAB_0017d327;
  }
  else {
    mtime = 0;
LAB_0017d327:
    bVar2 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeSucceeded,local_158);
    if (bVar2) {
      Edge::GetUnescapedRspfile_abi_cxx11_(&local_178,this_00);
      if ((local_178._M_string_length != 0) && (g_keep_rsp == false)) {
        pBVar1 = this_00->env_;
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,local_178._M_dataplus._M_p,
                   local_178._M_dataplus._M_p + local_178._M_string_length);
        RelPathEnv::ApplyChdir(&local_150,&pBVar1->super_RelPathEnv,&local_a0);
        std::__cxx11::string::operator=((string *)&local_178,(string *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        (*(this->disk_interface_->super_FileReader)._vptr_FileReader[8])
                  (this->disk_interface_,&local_178);
      }
      this_01 = (this->scan_).build_log_;
      if ((this_01 == (BuildLog *)0x0) ||
         (bVar2 = BuildLog::RecordCommand(this_01,this_00,local_12c,local_130,mtime), bVar2)) {
        bVar2 = true;
        if ((local_d0._M_string_length != 0) && (this->config_->dry_run == false)) {
          ppNVar13 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          if ((long)(this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppNVar13 != 8) {
            __assert_fail("edge->outputs_.size() == 1 && \"should have been rejected by parser\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build.cc"
                          ,0x41e,"bool Builder::FinishCommand(CommandRunner::Result *, string *)");
          }
          node = *ppNVar13;
          iVar5 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                            (this->disk_interface_,&node->env_path_,local_158);
          if (CONCAT44(extraout_var_02,iVar5) == -1) goto LAB_0017d5cb;
          bVar4 = DepsLog::RecordDeps((this->scan_).dep_loader_.deps_log_,node,
                                      CONCAT44(extraout_var_02,iVar5),&local_e8);
          if (!bVar4) {
            local_108[0] = local_f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_108,"Error writing to deps log: ","");
            piVar9 = __errno_location();
            strerror(*piVar9);
            plVar10 = (long *)std::__cxx11::string::append((char *)local_108);
            goto LAB_0017d542;
          }
        }
      }
      else {
        local_108[0] = local_f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"Error writing to build log: ","");
        piVar9 = __errno_location();
        strerror(*piVar9);
        plVar10 = (long *)std::__cxx11::string::append((char *)local_108);
LAB_0017d542:
        psVar12 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_150.field_2._M_allocated_capacity = *psVar12;
          local_150.field_2._8_8_ = plVar10[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar12;
          local_150._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_150._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_158,(string *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if (local_108[0] != local_f8) {
          operator_delete(local_108[0],local_f8[0] + 1);
        }
LAB_0017d5cb:
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,
                        CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                 local_178.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0017d5e9;
    }
  }
  bVar2 = false;
LAB_0017d5e9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar2;
}

Assistant:

bool Builder::FinishCommand(CommandRunner::Result* result, string* err) {
  METRIC_RECORD("FinishCommand");

  Edge* edge = result->edge;

  // First try to extract dependencies from the result, if any.
  // This must happen first as it filters the command output (we want
  // to filter /showIncludes output, even on compile failure) and
  // extraction itself can fail, which makes the command fail from a
  // build perspective.
  vector<Node*> deps_nodes;
  string deps_type = edge->GetBinding("deps");
  const string deps_prefix = edge->GetBinding("msvc_deps_prefix");
  if (!deps_type.empty()) {
    string extract_err;
    if (!ExtractDeps(result, deps_type, deps_prefix, &deps_nodes,
                     &extract_err) &&
        result->success()) {
      if (!result->output.empty())
        result->output.append("\n");
      result->output.append(extract_err);
      result->status = ExitFailure;
    }
  }

  int start_time, end_time;
  status_->BuildEdgeFinished(edge, result->success(), result->output,
                             &start_time, &end_time);

  // The rest of this function only applies to successful commands.
  if (!result->success()) {
    return plan_.EdgeFinished(edge, Plan::kEdgeFailed, err);
  }

  // Restat the edge outputs
  TimeStamp output_mtime = 0;
  bool restat = edge->GetBindingBool("restat");
  if (!config_.dry_run) {
    bool node_cleaned = false;

    for (vector<Node*>::iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), err);
      if (new_mtime == -1)
        return false;
      if (new_mtime > output_mtime)
        output_mtime = new_mtime;
      if ((*o)->mtime() == new_mtime && restat) {
        // The rule command did not change the output.  Propagate the clean
        // state through the build graph.
        // Note that this also applies to nonexistent outputs (mtime == 0).
        if (!plan_.CleanNode(&scan_, *o, err))
          return false;
        node_cleaned = true;
      }
    }

    if (node_cleaned) {
      TimeStamp restat_mtime = 0;
      // If any output was cleaned, find the most recent mtime of any
      // (existing) non-order-only input or the depfile.
      for (vector<Node*>::iterator i = edge->inputs_.begin();
           i != edge->inputs_.end() - edge->order_only_deps_; ++i) {
        TimeStamp input_mtime = disk_interface_->Stat((*i)->path(), err);
        if (input_mtime == -1)
          return false;
        if (input_mtime > restat_mtime)
          restat_mtime = input_mtime;
      }

      // The depfile will not have current chdir and must be fixed up.
      // But first detect whether depfile was absent.
      string depfile = edge->GetUnescapedDepfile();
      if (restat_mtime != 0 && deps_type.empty() && !depfile.empty()) {
        // Apply chdir fixup.
        depfile = edge->env_->ApplyChdir(depfile);
        TimeStamp depfile_mtime = disk_interface_->Stat(depfile, err);
        if (depfile_mtime == -1)
          return false;
        if (depfile_mtime > restat_mtime)
          restat_mtime = depfile_mtime;
      }

      // The total number of edges in the plan may have changed as a result
      // of a restat.
      status_->PlanHasTotalEdges(plan_.command_edge_count());

      output_mtime = restat_mtime;
    }
  }

  if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err))
    return false;

  // Delete any left over response file.
  // The rspfile will not have current chdir and must be fixed up.
  // But first detect whether rspfile was absent.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty() && !g_keep_rsp) {
    // Apply chdir fixup.
    rspfile = edge->env_->ApplyChdir(rspfile);
    disk_interface_->RemoveFile(rspfile);
  }

  if (scan_.build_log()) {
    if (!scan_.build_log()->RecordCommand(edge, start_time, end_time,
                                          output_mtime)) {
      *err = string("Error writing to build log: ") + strerror(errno);
      return false;
    }
  }

  if (!deps_type.empty() && !config_.dry_run) {
    assert(edge->outputs_.size() == 1 && "should have been rejected by parser");
    Node* out = edge->outputs_[0];
    TimeStamp deps_mtime = disk_interface_->Stat(out->path(), err);
    if (deps_mtime == -1)
      return false;
    if (!scan_.deps_log()->RecordDeps(out, deps_mtime, deps_nodes)) {
      *err = string("Error writing to deps log: ") + strerror(errno);
      return false;
    }
  }
  return true;
}